

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdReplace<wabt::interp::Simd<double,(unsigned_char)2>,double>
          (Thread *this,Instr instr)

{
  Simd<double,_(unsigned_char)__x02_> local_20;
  double local_10;
  
  local_10 = Pop<double>(this);
  local_20 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  local_20.v[instr.field_2.imm_u8] = local_10;
  Push<wabt::interp::Simd<double,(unsigned_char)2>>(this,local_20);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}